

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Fraction * __thiscall Matrix::At(Matrix *this,int i,int j)

{
  const_reference this_00;
  const_reference pvVar1;
  
  this_00 = std::
            vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
            ::at(&this->elements_,(long)i);
  pvVar1 = std::vector<Fraction,_std::allocator<Fraction>_>::at(this_00,(long)j);
  return pvVar1;
}

Assistant:

const Fraction& Matrix::At(int i, int j) const {
  return elements_.at(i).at(j);
}